

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_writer.cpp
# Opt level: O1

void snestistics::asm_writer
               (ReportWriter *report,Options *options,Trace *trace,AnnotationResolver *annotations,
               RomAccessor *rom_accessor)

{
  LargeBitfield *labels;
  pointer pOVar1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  _Rb_tree_color p;
  FILE *__s;
  pointer pAVar8;
  char *pcVar9;
  pointer pDVar10;
  byte bVar11;
  uint3 uVar12;
  uint3 uVar13;
  uint3 uVar14;
  short sVar15;
  undefined3 uVar16;
  Pointer PVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  size_type sVar22;
  FILE *__stream;
  char cVar23;
  byte bVar24;
  byte bVar25;
  uint8_t uVar26;
  uint8_t uVar27;
  ushort uVar28;
  int iVar29;
  int iVar30;
  uint32_t numBytesUsed;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  ushort *puVar34;
  size_t sVar35;
  _Rb_tree_header *p_Var36;
  byte *data;
  mapped_type *pmVar37;
  ulong uVar38;
  _Rb_tree_node_base *p_Var39;
  long lVar40;
  _Base_ptr p_Var41;
  bool bVar42;
  int iVar43;
  string *psVar44;
  ulong uVar45;
  _Base_ptr p_Var46;
  _Base_ptr p_Var47;
  _Rb_tree_header *p_Var48;
  uint8_t b;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  _Rb_tree_color _Var52;
  uint uVar53;
  pointer pOVar54;
  size_type_conflict __new_size;
  _Alloc_hider _Var55;
  _Base_ptr *p_00;
  uint uVar56;
  vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_> *__range1;
  byte bVar57;
  Annotation *a;
  pointer pAVar58;
  uint uVar59;
  uint uVar60;
  Annotation *a_1;
  ulong uVar61;
  ulong uVar62;
  bool bVar63;
  bool bVar64;
  int local_3324;
  int local_3308;
  uint local_3304;
  int local_3300;
  int local_32ec;
  uint local_32e8;
  int numBitsNeeded;
  vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> variants;
  byte local_32a4;
  string use_comment_1;
  AsmWriteWLADX writer;
  Proposals proposals;
  string name_2;
  string line_comment;
  anon_class_24_3_79b0c3fc variant_writer;
  string local_3168;
  char target_1 [128];
  char target_label [128];
  string line_comment_1;
  int local_2048;
  string line_use_comment;
  int local_1040;
  Array<unsigned_char> header;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1028 [255];
  int local_38;
  
  writer.m_nextPC = 0xffffffff;
  writer.m_bankOpen = false;
  writer.m_sectionCounter = 0;
  __s = (FILE *)report->report;
  pAVar58 = (annotations->_annotations).
            super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pAVar8 = (annotations->_annotations).
           super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  writer.m_options = options;
  writer.m_romData = rom_accessor;
  writer.m_outFile = (FILE *)__s;
  writer.m_report = report;
  if (pAVar58 != pAVar8) {
    do {
      if ((pAVar58->type == ANNOTATION_FUNCTION) ||
         ((pAVar58->type == ANNOTATION_LINE && ((pAVar58->name)._M_string_length != 0)))) {
        LargeBitfield::set_bit(&trace->labels,pAVar58->startOfRange,true);
      }
      pAVar58 = pAVar58 + 1;
    } while (pAVar58 != pAVar8);
  }
  ReportWriter::writeSeperator(report,"Header");
  if ((options->asm_header_file)._M_string_length != 0) {
    header._data = (uchar *)0x0;
    header._8_8_ = header._8_8_ & 0xffffffff00000000;
    read_file(&options->asm_header_file,&header);
    if ((header._8_8_ & 0xffffffff) == 0) {
      __assert_fail("index<_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/utils.h"
                    ,0x129,
                    "T &snestistics::Array<unsigned char>::operator[](const uint64_t) [T = unsigned char]"
                   );
    }
    fwrite(header._data,header._8_8_ & 0xffffffff,1,(FILE *)report->report);
    fputc(10,(FILE *)report->report);
    if (header._data != (uchar *)0x0) {
      operator_delete__(header._data);
    }
  }
  fwrite(".SNESNATIVEVECTOR      ; Define Native Mode interrupt vector table\n",0x43,1,__s);
  puVar34 = (ushort *)RomAccessor::evalPtr(rom_accessor,0xffe4);
  labels = &trace->labels;
  uVar28 = *puVar34;
  if ((labels->_state[uVar28 >> 5] >> (uVar28 & 0x1f) & 1) != 0) {
    AnnotationResolver::label((string *)&header,annotations,(uint)uVar28,(string *)0x0,true);
    if (header._8_8_ != 0) {
      fprintf(__s,"  %-6s %s\n","COP");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)header._data != local_1028) {
        operator_delete(header._data);
      }
      goto LAB_00127e4e;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)header._data != local_1028) {
      operator_delete(header._data);
    }
  }
  fprintf(__s,"  %-6s $%04X\n","COP",(ulong)(uint)uVar28);
LAB_00127e4e:
  anon_unknown.dwarf_190be::AsmWriteWLADX::write_vector_single
            (&writer,"BRK",annotations,labels,0xffe6);
  anon_unknown.dwarf_190be::AsmWriteWLADX::write_vector_single
            (&writer,"ABORT",annotations,labels,0xffe8);
  anon_unknown.dwarf_190be::AsmWriteWLADX::write_vector_single
            (&writer,"NMI",annotations,labels,0xffea);
  anon_unknown.dwarf_190be::AsmWriteWLADX::write_vector_single
            (&writer,"IRQ",annotations,labels,0xffee);
  fwrite(".ENDNATIVEVECTOR\n",0x11,1,__s);
  fwrite("\n.SNESEMUVECTOR         ; Define Emulation Mode interrupt vector table\n",0x47,1,__s);
  anon_unknown.dwarf_190be::AsmWriteWLADX::write_vector_single
            (&writer,"COP",annotations,labels,0xfff4);
  anon_unknown.dwarf_190be::AsmWriteWLADX::write_vector_single
            (&writer,"ABORT",annotations,labels,0xfff8);
  anon_unknown.dwarf_190be::AsmWriteWLADX::write_vector_single
            (&writer,"NMI",annotations,labels,0xfffa);
  anon_unknown.dwarf_190be::AsmWriteWLADX::write_vector_single
            (&writer,"RESET",annotations,labels,0xfffc);
  anon_unknown.dwarf_190be::AsmWriteWLADX::write_vector_single
            (&writer,"IRQBRK",annotations,labels,0xfffe);
  fwrite(".ENDEMUVECTOR\n",0xe,1,__s);
  ReportWriter::writeSeperator(report,"Data");
  pAVar58 = (annotations->_annotations).
            super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pAVar8 = (annotations->_annotations).
           super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pAVar58 != pAVar8) {
    do {
      if (pAVar58->type == ANNOTATION_DATA) {
        sprintf((char *)&header,"$%04X",(ulong)(ushort)pAVar58->startOfRange);
        line_comment_1._M_dataplus._M_p = (pointer)&line_comment_1.field_2;
        sVar35 = strlen((char *)&header);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&line_comment_1,&header,(long)local_1028 + (sVar35 - 0x10));
        psVar44 = &pAVar58->comment;
        if ((pAVar58->comment)._M_string_length == 0) {
          psVar44 = &pAVar58->useComment;
        }
        iVar29 = fprintf(__s,".EQU %s %s",(pAVar58->name)._M_dataplus._M_p,
                         line_comment_1._M_dataplus._M_p);
        iVar30 = 0x48;
        if (0x48 < iVar29) {
          iVar30 = iVar29;
        }
        anon_unknown.dwarf_190be::AsmWriteWLADX::writeCommentHelper
                  (&writer,iVar29,(iVar30 - 0x45U & 0xfffffffc) + 0x48,psVar44);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line_comment_1._M_dataplus._M_p != &line_comment_1.field_2) {
          operator_delete(line_comment_1._M_dataplus._M_p);
        }
      }
      pAVar58 = pAVar58 + 1;
    } while (pAVar58 != pAVar8);
  }
  ReportWriter::writeSeperator(report,"Code");
  variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::reserve(&variants,0x10000)
  ;
  p_Var41 = (trace->ops)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var36 = &(trace->ops)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var41 != p_Var36) {
    uVar50 = 0xffffffff;
    do {
      p = p_Var41[1]._M_color;
      uVar38 = (ulong)uVar50;
      if (uVar50 == 0xffffffff) {
        uVar38 = (ulong)p;
      }
      if (p < (_Rb_tree_color)uVar38) {
        bVar42 = false;
      }
      else {
        bVar42 = false;
        do {
          _Var52 = (_Rb_tree_color)uVar38;
          if ((labels->_state[uVar38 >> 5] >> (_Var52 & 0x1f) & 1) != 0) {
            header._data = (uchar *)local_1028;
            header._size = 0;
            header._12_4_ = 0;
            local_1028[0]._M_local_buf[0] = '\0';
            line_comment_1._M_string_length = 0;
            line_comment_1.field_2._M_local_buf[0] = '\0';
            line_use_comment._M_dataplus._M_p = (pointer)&line_use_comment.field_2;
            line_use_comment._M_string_length = 0;
            line_use_comment.field_2._M_local_buf[0] = '\0';
            line_comment_1._M_dataplus._M_p = (pointer)&line_comment_1.field_2;
            AnnotationResolver::line_info
                      (annotations,_Var52,(string *)&header,&line_comment_1,&line_use_comment,true);
            target_1._0_8_ = target_1 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)target_1,line_comment_1._M_dataplus._M_p,
                       line_comment_1._M_dataplus._M_p + line_comment_1._M_string_length);
            if (line_comment_1._M_string_length == 0) {
              std::__cxx11::string::_M_assign((string *)target_1);
            }
            target_label._0_8_ = target_label + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)target_label,target_1._0_8_,target_1._8_8_ + target_1._0_8_);
            proposals._M_t._M_impl._0_8_ =
                 &proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            std::__cxx11::string::_M_construct<char_const*>((string *)&proposals,"");
            anon_unknown.dwarf_190be::AsmWriteWLADX::prepareWrite(&writer,_Var52,true);
            __stream = writer.m_outFile;
            fputc(10,(FILE *)writer.m_outFile);
            if (target_label._8_8_ != 0) {
              anon_unknown.dwarf_190be::AsmWriteWLADX::writeCommentHelper
                        (&writer,0,0,(string *)target_label);
            }
            iVar30 = fprintf((FILE *)__stream,"%s:",header._data);
            if (CONCAT44(proposals._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                         proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_color) != 0) {
              iVar29 = 0x48;
              if (0x48 < iVar30) {
                iVar29 = iVar30;
              }
              iVar29 = (iVar29 - 0x45U & 0xfffffffc) + 0x48;
              iVar43 = iVar29 - iVar30;
              if (iVar29 < iVar30) {
                __assert_fail("target >= pos",
                              "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                              ,0xf2,
                              "int (anonymous namespace)::AsmWriteWLADX::indent_column(FILE *, int, int, bool)"
                             );
              }
              if (0x9f < iVar43) {
                __assert_fail("wanted_spaces <= 159",
                              "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                              ,0xf4,
                              "int (anonymous namespace)::AsmWriteWLADX::indent_column(FILE *, int, int, bool)"
                             );
              }
              fwrite((anonymous_namespace)::AsmWriteWLADX::indent_column(_IO_FILE*,int,int,bool)::
                     spaces,1,(long)iVar43,(FILE *)__stream);
              fprintf((FILE *)__stream,"; %s",proposals._M_t._M_impl._0_8_);
            }
            fputc(10,(FILE *)__stream);
            if ((_Base_ptr *)proposals._M_t._M_impl._0_8_ !=
                &proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)proposals._M_t._M_impl._0_8_);
            }
            if ((char *)target_label._0_8_ != target_label + 0x10) {
              operator_delete((void *)target_label._0_8_);
            }
            if (p == _Var52) {
              bVar42 = true;
            }
            if ((char *)target_1._0_8_ != target_1 + 0x10) {
              operator_delete((void *)target_1._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)line_use_comment._M_dataplus._M_p != &line_use_comment.field_2) {
              operator_delete(line_use_comment._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)line_comment_1._M_dataplus._M_p != &line_comment_1.field_2) {
              operator_delete(line_comment_1._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)header._data != local_1028) {
              operator_delete(header._data);
            }
          }
          uVar38 = (ulong)(_Var52 + _S_black);
        } while (_Var52 + _S_black <= p);
      }
      uVar38 = *(ulong *)&p_Var41[1].field_0x4;
      uVar61 = uVar38 >> 0x20;
      p_Var2 = &proposals._M_t._M_impl.super__Rb_tree_header;
      if (uVar61 == 0) {
        __assert_fail("variant_lookup.count != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                      ,0x26d,
                      "void snestistics::asm_writer(ReportWriter &, const Options &, Trace &, const AnnotationResolver &, const RomAccessor &)"
                     );
      }
      data = RomAccessor::evalPtr(rom_accessor,p);
      bVar5 = *data;
      uVar38 = uVar38 & 0xffffffff;
      pOVar1 = (trace->ops_variants).
               super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl
               .super__Vector_impl_data._M_start + uVar38;
      uVar50._0_2_ = pOVar1->P;
      uVar50._2_2_ = pOVar1->DP;
      uVar53 = 1 << ((byte)p & 0x1f) & (trace->is_predicted)._state[p >> 5];
      if ((uVar50 >> 8 & 1) != 0) {
        printf("emu mode at pc %06X\n",(ulong)p);
      }
      target_1[0x70] = '\0';
      target_1[0x71] = '\0';
      target_1[0x72] = '\0';
      target_1[0x73] = '\0';
      target_1[0x74] = '\0';
      target_1[0x75] = '\0';
      target_1[0x76] = '\0';
      target_1[0x77] = '\0';
      target_1[0x78] = '\0';
      target_1[0x79] = '\0';
      target_1[0x7a] = '\0';
      target_1[0x7b] = '\0';
      target_1[0x7c] = '\0';
      target_1[0x7d] = '\0';
      target_1[0x7e] = '\0';
      target_1[0x7f] = '\0';
      target_1[0x60] = '\0';
      target_1[0x61] = '\0';
      target_1[0x62] = '\0';
      target_1[99] = '\0';
      target_1[100] = '\0';
      target_1[0x65] = '\0';
      target_1[0x66] = '\0';
      target_1[0x67] = '\0';
      target_1[0x68] = '\0';
      target_1[0x69] = '\0';
      target_1[0x6a] = '\0';
      target_1[0x6b] = '\0';
      target_1[0x6c] = '\0';
      target_1[0x6d] = '\0';
      target_1[0x6e] = '\0';
      target_1[0x6f] = '\0';
      target_1[0x50] = '\0';
      target_1[0x51] = '\0';
      target_1[0x52] = '\0';
      target_1[0x53] = '\0';
      target_1[0x54] = '\0';
      target_1[0x55] = '\0';
      target_1[0x56] = '\0';
      target_1[0x57] = '\0';
      target_1[0x58] = '\0';
      target_1[0x59] = '\0';
      target_1[0x5a] = '\0';
      target_1[0x5b] = '\0';
      target_1[0x5c] = '\0';
      target_1[0x5d] = '\0';
      target_1[0x5e] = '\0';
      target_1[0x5f] = '\0';
      target_1[0x40] = '\0';
      target_1[0x41] = '\0';
      target_1[0x42] = '\0';
      target_1[0x43] = '\0';
      target_1[0x44] = '\0';
      target_1[0x45] = '\0';
      target_1[0x46] = '\0';
      target_1[0x47] = '\0';
      target_1[0x48] = '\0';
      target_1[0x49] = '\0';
      target_1[0x4a] = '\0';
      target_1[0x4b] = '\0';
      target_1[0x4c] = '\0';
      target_1[0x4d] = '\0';
      target_1[0x4e] = '\0';
      target_1[0x4f] = '\0';
      target_1[0x30] = '\0';
      target_1[0x31] = '\0';
      target_1[0x32] = '\0';
      target_1[0x33] = '\0';
      target_1[0x34] = '\0';
      target_1[0x35] = '\0';
      target_1[0x36] = '\0';
      target_1[0x37] = '\0';
      target_1[0x38] = '\0';
      target_1[0x39] = '\0';
      target_1[0x3a] = '\0';
      target_1[0x3b] = '\0';
      target_1[0x3c] = '\0';
      target_1[0x3d] = '\0';
      target_1[0x3e] = '\0';
      target_1[0x3f] = '\0';
      target_1[0x20] = '\0';
      target_1[0x21] = '\0';
      target_1[0x22] = '\0';
      target_1[0x23] = '\0';
      target_1[0x24] = '\0';
      target_1[0x25] = '\0';
      target_1[0x26] = '\0';
      target_1[0x27] = '\0';
      target_1[0x28] = '\0';
      target_1[0x29] = '\0';
      target_1[0x2a] = '\0';
      target_1[0x2b] = '\0';
      target_1[0x2c] = '\0';
      target_1[0x2d] = '\0';
      target_1[0x2e] = '\0';
      target_1[0x2f] = '\0';
      target_1[0x10] = '\0';
      target_1[0x11] = '\0';
      target_1[0x12] = '\0';
      target_1[0x13] = '\0';
      target_1[0x14] = '\0';
      target_1[0x15] = '\0';
      target_1[0x16] = '\0';
      target_1[0x17] = '\0';
      target_1[0x18] = '\0';
      target_1[0x19] = '\0';
      target_1[0x1a] = '\0';
      target_1[0x1b] = '\0';
      target_1[0x1c] = '\0';
      target_1[0x1d] = '\0';
      target_1[0x1e] = '\0';
      target_1[0x1f] = '\0';
      target_1[0] = '\0';
      target_1[1] = '\0';
      target_1[2] = '\0';
      target_1[3] = '\0';
      target_1[4] = '\0';
      target_1[5] = '\0';
      target_1[6] = '\0';
      target_1[7] = '\0';
      target_1[8] = '\0';
      target_1[9] = '\0';
      target_1[10] = '\0';
      target_1[0xb] = '\0';
      target_1[0xc] = '\0';
      target_1[0xd] = '\0';
      target_1[0xe] = '\0';
      target_1[0xf] = '\0';
      target_label[0x70] = '\0';
      target_label[0x71] = '\0';
      target_label[0x72] = '\0';
      target_label[0x73] = '\0';
      target_label[0x74] = '\0';
      target_label[0x75] = '\0';
      target_label[0x76] = '\0';
      target_label[0x77] = '\0';
      target_label[0x78] = '\0';
      target_label[0x79] = '\0';
      target_label[0x7a] = '\0';
      target_label[0x7b] = '\0';
      target_label[0x7c] = '\0';
      target_label[0x7d] = '\0';
      target_label[0x7e] = '\0';
      target_label[0x7f] = '\0';
      target_label[0x60] = '\0';
      target_label[0x61] = '\0';
      target_label[0x62] = '\0';
      target_label[99] = '\0';
      target_label[100] = '\0';
      target_label[0x65] = '\0';
      target_label[0x66] = '\0';
      target_label[0x67] = '\0';
      target_label[0x68] = '\0';
      target_label[0x69] = '\0';
      target_label[0x6a] = '\0';
      target_label[0x6b] = '\0';
      target_label[0x6c] = '\0';
      target_label[0x6d] = '\0';
      target_label[0x6e] = '\0';
      target_label[0x6f] = '\0';
      target_label[0x50] = '\0';
      target_label[0x51] = '\0';
      target_label[0x52] = '\0';
      target_label[0x53] = '\0';
      target_label[0x54] = '\0';
      target_label[0x55] = '\0';
      target_label[0x56] = '\0';
      target_label[0x57] = '\0';
      target_label[0x58] = '\0';
      target_label[0x59] = '\0';
      target_label[0x5a] = '\0';
      target_label[0x5b] = '\0';
      target_label[0x5c] = '\0';
      target_label[0x5d] = '\0';
      target_label[0x5e] = '\0';
      target_label[0x5f] = '\0';
      target_label[0x40] = '\0';
      target_label[0x41] = '\0';
      target_label[0x42] = '\0';
      target_label[0x43] = '\0';
      target_label[0x44] = '\0';
      target_label[0x45] = '\0';
      target_label[0x46] = '\0';
      target_label[0x47] = '\0';
      target_label[0x48] = '\0';
      target_label[0x49] = '\0';
      target_label[0x4a] = '\0';
      target_label[0x4b] = '\0';
      target_label[0x4c] = '\0';
      target_label[0x4d] = '\0';
      target_label[0x4e] = '\0';
      target_label[0x4f] = '\0';
      target_label[0x30] = '\0';
      target_label[0x31] = '\0';
      target_label[0x32] = '\0';
      target_label[0x33] = '\0';
      target_label[0x34] = '\0';
      target_label[0x35] = '\0';
      target_label[0x36] = '\0';
      target_label[0x37] = '\0';
      target_label[0x38] = '\0';
      target_label[0x39] = '\0';
      target_label[0x3a] = '\0';
      target_label[0x3b] = '\0';
      target_label[0x3c] = '\0';
      target_label[0x3d] = '\0';
      target_label[0x3e] = '\0';
      target_label[0x3f] = '\0';
      target_label[0x20] = '\0';
      target_label[0x21] = '\0';
      target_label[0x22] = '\0';
      target_label[0x23] = '\0';
      target_label[0x24] = '\0';
      target_label[0x25] = '\0';
      target_label[0x26] = '\0';
      target_label[0x27] = '\0';
      target_label[0x28] = '\0';
      target_label[0x29] = '\0';
      target_label[0x2a] = '\0';
      target_label[0x2b] = '\0';
      target_label[0x2c] = '\0';
      target_label[0x2d] = '\0';
      target_label[0x2e] = '\0';
      target_label[0x2f] = '\0';
      target_label[0x10] = '\0';
      target_label[0x11] = '\0';
      target_label[0x12] = '\0';
      target_label[0x13] = '\0';
      target_label[0x14] = '\0';
      target_label[0x15] = '\0';
      target_label[0x16] = '\0';
      target_label[0x17] = '\0';
      target_label[0x18] = '\0';
      target_label[0x19] = '\0';
      target_label[0x1a] = '\0';
      target_label[0x1b] = '\0';
      target_label[0x1c] = '\0';
      target_label[0x1d] = '\0';
      target_label[0x1e] = '\0';
      target_label[0x1f] = '\0';
      target_label[0] = '\0';
      target_label[1] = '\0';
      target_label[2] = '\0';
      target_label[3] = '\0';
      target_label[4] = '\0';
      target_label[5] = '\0';
      target_label[6] = '\0';
      target_label[7] = '\0';
      target_label[8] = '\0';
      target_label[9] = '\0';
      target_label[10] = '\0';
      target_label[0xb] = '\0';
      target_label[0xc] = '\0';
      target_label[0xd] = '\0';
      target_label[0xe] = '\0';
      target_label[0xf] = '\0';
      numBitsNeeded = 8;
      numBytesUsed = calculateFormattingandSize
                               (data,(uVar50 & 0x20) == 0,(uVar50 & 0x10) == 0,target_1,target_label
                                ,&numBitsNeeded);
      proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      uVar31 = 0;
      proposals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      uVar50 = *(uint *)(op_codes + (ulong)bVar5 * 0x10 + 8);
      bVar25 = (byte)uVar50;
      bVar6 = (&jumps)[bVar5];
      if (uVar50 < 0x11 && bVar6 == 0) {
        uVar31 = 0x1801f >> (bVar25 & 0x1f);
      }
      proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::resize
                (&variants,uVar61);
      bVar24 = (byte)(0x81a034 >> (bVar25 & 0x1f)) & uVar50 < 0x18;
      bVar4 = uVar50 < 0xe & (byte)(0x3086 >> (bVar25 & 0x1f));
      bVar25 = (byte)(0x854008 >> (bVar25 & 0x1f)) & uVar50 < 0x18;
      bVar57 = uVar50 - 0xb < 8 & (bVar6 ^ 1);
      memcpy(variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (trace->ops_variants).
             super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl.
             super__Vector_impl_data._M_start + uVar38,uVar61 * 0x14);
      pOVar1 = variants.
               super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        uVar59 = 0x10000;
        uVar14 = 0;
        uVar56 = 1;
        local_3300 = 0;
        local_3304 = 0;
        uVar50 = 1;
        local_3308 = 0;
        local_32e8 = 0;
        uVar49 = 0;
        uVar51 = 0;
        uVar32 = 1;
        local_3324 = 0;
      }
      else {
        uVar32 = 1;
        local_3324 = 0;
        uVar51 = 0;
        iVar30 = 0;
        uVar59 = 1;
        local_32e8 = 0;
        local_3308 = 0;
        uVar50 = 1;
        local_3304 = 0;
        local_3300 = 0;
        uVar56 = 1;
        uVar14 = 0;
        uVar49 = 0;
        pOVar54 = variants.
                  super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          bVar63 = (pOVar54->P & 0x20) == 0;
          if (SUB41(local_3304,0) != bVar63) {
            uVar50 = uVar49;
            local_3304 = 0;
          }
          if (local_3308 == 0) {
            uVar50 = 1;
            local_3308 = 1;
            local_3304 = (uint)bVar63;
          }
          bVar63 = (pOVar54->P & 0x10) == 0;
          if (SUB31(uVar14,0) != bVar63) {
            uVar56 = uVar49;
            uVar14 = 0;
          }
          if (local_3300 == 0) {
            uVar56 = 1;
            local_3300 = 1;
            uVar14 = (uint3)bVar63;
          }
          if ((ushort)local_32e8 != pOVar54->DP) {
            uVar59 = uVar49;
            local_32e8 = uVar49;
          }
          if (iVar30 == 0) {
            uVar59 = 1;
            iVar30 = 1;
            local_32e8 = (uint)pOVar54->DP;
          }
          uVar60 = uVar51 & 0xff;
          if ((char)uVar51 != (char)*(uint *)&pOVar54->DB) {
            uVar32 = uVar49;
            uVar60 = 0;
          }
          uVar51 = uVar60;
          if (local_3324 == 0) {
            uVar51 = *(uint *)&pOVar54->DB;
          }
          if (local_3324 == 0) {
            uVar32 = 1;
            local_3324 = 1;
          }
          if (bVar4 == 0) {
            pOVar54->X = 0;
          }
          if (bVar25 == 0) {
            pOVar54->Y = 0;
          }
          if ((uVar31 & 1) == 0) {
            pOVar54->DB = '\0';
          }
          if (bVar57 == 0) {
            pOVar54->DP = 0;
          }
          if (bVar24 == 0) {
            pOVar54->indirect_base_pointer = 0;
          }
          pOVar54 = pOVar54 + 1;
        } while (pOVar54 !=
                 variants.
                 super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
        uVar49 = iVar30 << 0x18;
        uVar59 = uVar59 << 0x10;
      }
      if (bVar5 == 0x82) {
        header._data = (uchar *)CONCAT44(header._data._4_4_,
                                         (uint)(-1 < (short)((ushort)data[2] << 8)) * 0x10000 +
                                         *(ushort *)(data + 1) + p + -0xfffd);
        pmVar37 = std::
                  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&proposals,(key_type *)&header);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar37,0,(char *)pmVar37->_M_string_length,0x16e073);
      }
      else if ((&branches)[bVar5] == '\x01') {
        header._data = (uchar *)CONCAT44(header._data._4_4_,
                                         (uint)(-1 < (char)data[1]) * 0x100 + data[1] + p + -0xfe);
        pmVar37 = std::
                  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&proposals,(key_type *)&header);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar37,0,(char *)pmVar37->_M_string_length,0x16e073);
      }
      else {
        if (variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          uVar38 = ((long)variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
          lVar40 = 0x3f;
          if (uVar38 != 0) {
            for (; uVar38 >> lVar40 == 0; lVar40 = lVar40 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<snestistics::OpInfo*,std::vector<snestistics::OpInfo,std::allocator<snestistics::OpInfo>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (variants.
                     super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     variants.
                     super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                     _M_impl.super__Vector_impl_data._M_finish,((uint)lVar40 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<snestistics::OpInfo*,std::vector<snestistics::OpInfo,std::allocator<snestistics::OpInfo>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pOVar1);
        }
        if (variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          __new_size = 0;
        }
        else {
          uVar38 = 0;
          uVar33 = 1;
          uVar60 = 0;
          do {
            if ((uVar60 == 0) ||
               (variants.
                super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar38].DB !=
                variants.
                super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar60 - 1].DB)) {
LAB_00128a42:
              uVar16 = *(undefined3 *)
                        &variants.
                         super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar38].field_0x11;
              variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar60].DB =
                   variants.
                   super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar38].DB;
              *(undefined3 *)
               &variants.
                super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar60].field_0x11 = uVar16;
              pOVar1 = variants.
                       super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar38;
              PVar17 = pOVar1->jump_target;
              uVar18 = pOVar1->P;
              uVar19 = pOVar1->DP;
              uVar20 = pOVar1->X;
              uVar21 = pOVar1->Y;
              pOVar54 = variants.
                        super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar60;
              pOVar54->indirect_base_pointer = pOVar1->indirect_base_pointer;
              pOVar54->jump_target = PVar17;
              pOVar54->P = uVar18;
              pOVar54->DP = uVar19;
              pOVar54->X = uVar20;
              pOVar54->Y = uVar21;
              uVar60 = uVar60 + 1;
            }
            else {
              pOVar1 = variants.
                       super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar38;
              pOVar54 = variants.
                        super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start + (uVar60 - 1);
              if ((pOVar1->DP != pOVar54->DP) ||
                 ((((pOVar1->indirect_base_pointer != pOVar54->indirect_base_pointer ||
                    (pOVar1->X != pOVar54->X)) || (pOVar1->Y != pOVar54->Y)) ||
                  ((pOVar1->P != pOVar54->P || (pOVar1->jump_target != pOVar54->jump_target))))))
              goto LAB_00128a42;
            }
            uVar38 = (ulong)uVar33;
            uVar61 = ((long)variants.
                            super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)variants.
                            super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
            uVar33 = uVar33 + 1;
          } while (uVar38 <= uVar61 && uVar61 - uVar38 != 0);
          __new_size = (size_type_conflict)uVar60;
        }
        std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::resize
                  (&variants,__new_size);
        if (bVar6 == 0) {
          if ((uVar53 == 0) &&
             (variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
            sVar15 = (short)p;
            uVar38 = 0;
            do {
              pOVar1 = variants.
                       super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              memset(&header,0,0x1004);
              uVar61 = uVar38;
              if (bVar4 != 0 || bVar25 != 0) {
                if (bVar4 != 0) {
                  lVar40 = (long)local_38;
                  local_1028[0]._M_local_buf[lVar40 + -0xe] = '\0';
                  *(undefined2 *)((long)local_1028 + lVar40 + -0x10) = 0x3d58;
                  local_38 = local_38 + 2;
                }
                if (bVar25 != 0) {
                  lVar40 = (long)local_38;
                  local_1028[0]._M_local_buf[lVar40 + -0xe] = '\0';
                  *(undefined2 *)((long)local_1028 + lVar40 + -0x10) = 0x3d59;
                  local_38 = local_38 + 2;
                }
                line_comment_1._M_dataplus._M_p = (pointer)0xffffffff;
                line_comment_1._M_string_length =
                     line_comment_1._M_string_length & 0xffffffff00000000;
                Range::add((Range *)&line_comment_1,(uint)(&pOVar1[uVar38].X)[bVar4 ^ 1]);
                uVar60 = (uint)uVar38;
                local_32ec = 0;
                bVar63 = true;
                do {
                  uVar60 = uVar60 + 1;
                  uVar62 = (ulong)uVar60;
                  uVar45 = ((long)variants.
                                  super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)variants.
                                  super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 2) *
                           -0x3333333333333333;
                  if (uVar45 < uVar62 || uVar45 - uVar62 == 0) break;
                  if ((variants.
                       super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar62].DB == pOVar1[uVar38].DB) &&
                     (variants.
                      super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar62].DP == pOVar1[uVar38].DP)) {
                    uVar28 = (&variants.
                               super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar62].X)[bVar4 ^ 1];
                    if (line_comment_1._M_dataplus._M_p._4_4_ < 2) {
LAB_00129a04:
                      Range::add((Range *)&line_comment_1,(uint)uVar28);
                    }
                    else {
                      if (((int)line_comment_1._M_string_length *
                           line_comment_1._M_dataplus._M_p._4_4_ +
                           (int)line_comment_1._M_dataplus._M_p == (uint)uVar28) ||
                         ((int)line_comment_1._M_string_length *
                          (line_comment_1._M_dataplus._M_p._4_4_ - 1) +
                          (int)line_comment_1._M_dataplus._M_p == (uint)uVar28)) goto LAB_00129a04;
                      lVar40 = (long)local_38;
                      if (lVar40 < 0x50) {
                        if (!bVar63) {
                          local_1028[0]._M_local_buf[lVar40 + -0xe] = '\0';
                          *(undefined2 *)((long)local_1028 + lVar40 + -0x10) = 0x202c;
                          local_38 = local_38 + 2;
                        }
                        Range::format((Range *)&line_comment_1,(StringBuilder *)&header);
                        bVar63 = false;
                      }
                      else {
                        local_32ec = local_32ec + 1;
                      }
                      line_comment_1._M_dataplus._M_p = (pointer)0xffffffff;
                      line_comment_1._M_string_length =
                           line_comment_1._M_string_length & 0xffffffff00000000;
                      Range::add((Range *)&line_comment_1,(uint)uVar28);
                    }
                    uVar61 = (ulong)((int)uVar61 + 1);
                    bVar64 = true;
                  }
                  else {
                    bVar64 = false;
                  }
                } while (bVar64);
                if (local_32ec == 0) {
                  if (!bVar63) {
                    lVar40 = (long)local_38;
                    local_1028[0]._M_local_buf[lVar40 + -0xe] = '\0';
                    *(undefined2 *)((long)local_1028 + lVar40 + -0x10) = 0x202c;
                    local_38 = local_38 + 2;
                  }
                  Range::format((Range *)&line_comment_1,(StringBuilder *)&header);
                }
                else {
                  StringBuilder::format((StringBuilder *)&header," and %d more");
                }
              }
              bVar5 = *data;
              uVar45 = (ulong)bVar5;
              iVar30 = *(int *)(opCodeInfo + uVar45 * 0x18 + 0x10);
              if (iVar30 < 4) goto switchD_00129e4a_caseD_d;
              local_32a4 = (byte)(p >> 0x10);
              if (iVar30 == 4) {
                bVar5 = data[1];
                uVar28 = sVar15 + -0xfe + (ushort)bVar5;
                if (-1 < (char)bVar5) {
                  uVar28 = sVar15 + 2 + (ushort)bVar5;
                }
                goto LAB_00129baf;
              }
              if ((uVar45 == 0x82) || (bVar5 == 0x62)) {
                uVar28 = (*(ushort *)(data + 1) << 8 | *(ushort *)(data + 1) >> 8) + sVar15 + 3;
                goto LAB_00129baf;
              }
              bVar7 = pOVar1[uVar38].DB;
              switch(iVar30) {
              case 6:
                local_32a4 = 0;
                uVar28 = pOVar1[uVar38].DP + (ushort)data[1];
                goto LAB_00129baf;
              default:
                if (bVar5 == 0xdc) {
                  if ((&jumps)[uVar45] != '\0') {
                    bVar7 = local_32a4;
                  }
                  uVar28 = 0;
                  bVar5 = 1;
                  bVar11 = 0;
                  local_32a4 = 0;
                  if (((char)data[2] < '\0') && ((char)bVar7 < '~')) {
                    uVar60 = (uint)bVar7 << 0x10 | (uint)data[2] << 8 | (uint)data[1];
                    uVar26 = RomAccessor::evalByte(rom_accessor,uVar60);
                    uVar27 = RomAccessor::evalByte(rom_accessor,uVar60 + 1);
                    uVar28 = CONCAT11(uVar27,uVar26);
                    bVar11 = 1;
                    bVar5 = 1;
                    local_32a4 = bVar7;
                  }
                }
                else {
                  if ((bVar5 & 0x7f) != 0x7c) goto switchD_00129e4a_caseD_d;
                  if ((&jumps)[uVar45] == '\0') {
                    __assert_fail("is_jump",
                                  "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                                  ,0xb4,
                                  "ResultType (anonymous namespace)::evaluateOp(const snestistics::RomAccessor &, const uint8_t *, const CPURegisters &, MagicByte *, MagicWord *, bool *, bool *, bool *, bool *)"
                                 );
                  }
                  bVar5 = 1;
                  bVar11 = 0;
                  local_32a4 = 0;
                  uVar28 = 0;
                }
                break;
              case 0xd:
switchD_00129e4a_caseD_d:
                bVar11 = 0;
                uVar28 = 0;
                bVar5 = 0;
                local_32a4 = 0;
                break;
              case 0xe:
              case 0xf:
              case 0x10:
                goto LAB_00129e5b;
              case 0x11:
              case 0x12:
                bVar7 = data[3];
LAB_00129e5b:
                uVar28 = *(ushort *)(data + 1);
                local_32a4 = bVar7;
LAB_00129baf:
                bVar11 = 1;
                bVar5 = 1;
              }
              if ((bool)(bVar11 & bVar5)) {
                uVar60 = (uint)local_32a4 * 0x10000 + (uint)uVar28;
                if ((-1 < (short)uVar28) && (((uint)local_32a4 * 0x10000 >> 0x16 & 1) == 0)) {
                  uVar60 = uVar28 + 0x7e0000;
                  if (0x1fff < uVar28) {
                    uVar60 = (uint)uVar28;
                  }
                }
                line_comment._M_dataplus._M_p._0_4_ = uVar60;
                p_Var46 = &proposals._M_t._M_impl.super__Rb_tree_header._M_header;
                for (p_Var47 = proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                    (_Rb_tree_header *)p_Var47 != (_Rb_tree_header *)0x0;
                    p_Var47 = (&p_Var47->_M_left)[bVar63]) {
                  bVar63 = (uint)*(size_t *)(p_Var47 + 1) < uVar60;
                  if (!bVar63) {
                    p_Var46 = p_Var47;
                  }
                }
                p_Var2 = &proposals._M_t._M_impl.super__Rb_tree_header;
                p_Var48 = p_Var2;
                if (((_Rb_tree_header *)p_Var46 != p_Var2) &&
                   (p_Var48 = (_Rb_tree_header *)p_Var46,
                   uVar60 < (uint)((_Rb_tree_header *)p_Var46)->_M_node_count)) {
                  p_Var48 = p_Var2;
                }
                if (p_Var48 == p_Var2) {
                  line_use_comment._M_dataplus._M_p = (pointer)&line_use_comment.field_2;
                  line_use_comment._M_string_length = 0;
                  line_use_comment.field_2._M_local_buf[0] = '\0';
                  bVar63 = local_38 != 0;
                  memset(&line_comment_1,0,0x1004);
                  if (bVar63 || (bVar57 != 0 || (uVar31 & 1) != 0)) {
                    *(undefined2 *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048) =
                         0x5b;
                    local_2048 = local_2048 + 1;
                  }
                  bVar64 = (uVar31 & 1) == 0;
                  if (!bVar64) {
                    StringBuilder::format
                              ((StringBuilder *)&line_comment_1,"DB=%X",(ulong)pOVar1[uVar38].DB);
                  }
                  if (bVar57 != 0) {
                    if (!bVar64) {
                      *(undefined2 *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048) =
                           0x20;
                      local_2048 = local_2048 + 1;
                    }
                    bVar64 = false;
                    StringBuilder::format
                              ((StringBuilder *)&line_comment_1,"DP=%X",(ulong)pOVar1[uVar38].DP);
                  }
                  if (local_38 != 0) {
                    if (!bVar64) {
                      *(undefined2 *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048) =
                           0x20;
                      local_2048 = local_2048 + 1;
                    }
                    sVar35 = strlen((char *)&header);
                    memcpy((void *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048),
                           &header,(long)((sVar35 << 0x20) + 0x100000000) >> 0x20);
                    local_2048 = local_2048 + (int)sVar35;
                  }
                  if (bVar63 || (bVar57 != 0 || (uVar31 & 1) != 0)) {
                    *(undefined2 *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048) =
                         0x5d;
                    local_2048 = local_2048 + 1;
                  }
                  pmVar37 = std::
                            map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&proposals,(key_type *)&line_comment);
                  pcVar9 = (char *)pmVar37->_M_string_length;
                  strlen((char *)&line_comment_1);
                  std::__cxx11::string::_M_replace((ulong)pmVar37,0,pcVar9,(ulong)&line_comment_1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)line_use_comment._M_dataplus._M_p != &line_use_comment.field_2) {
                    operator_delete(line_use_comment._M_dataplus._M_p);
                  }
                }
              }
              uVar38 = (ulong)((int)uVar61 + 1);
              uVar61 = ((long)variants.
                              super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)variants.
                              super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
            } while (uVar38 <= uVar61 && uVar61 - uVar38 != 0);
          }
        }
        else if (variants.
                 super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish !=
                 variants.
                 super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start) {
          uVar38 = 0;
          uVar61 = 1;
          do {
            pOVar1 = variants.
                     super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (variants.
                super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar38].jump_target != 0xffffffff) {
              memset(&header,0,0x1004);
              if (bVar4 != 0) {
                StringBuilder::format((StringBuilder *)&header,"[X=%04X]",(ulong)pOVar1[uVar38].X);
              }
              pmVar37 = std::
                        map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&proposals,&pOVar1[uVar38].jump_target);
              pcVar9 = (char *)pmVar37->_M_string_length;
              strlen((char *)&header);
              std::__cxx11::string::_M_replace((ulong)pmVar37,0,pcVar9,(ulong)&header);
            }
            uVar38 = ((long)variants.
                            super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)variants.
                            super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
            bVar63 = uVar61 <= uVar38;
            lVar40 = uVar38 - uVar61;
            uVar38 = uVar61;
            uVar61 = (ulong)((int)uVar61 + 1);
          } while (bVar63 && lVar40 != 0);
        }
      }
      line_comment._M_dataplus._M_p = (pointer)&line_comment.field_2;
      line_comment._M_string_length = 0;
      line_comment.field_2._M_local_buf[0] = '\0';
      if (!bVar42) {
        AnnotationResolver::line_info(annotations,p,(string *)0x0,&line_comment,(string *)0x0,false)
        ;
      }
      variant_writer.line_comment = &line_comment;
      variant_writer.annotations = annotations;
      variant_writer.is_jump = (bool)bVar6;
      memset((StringBuilder *)&header,0,0x1004);
      iVar30 = numBitsNeeded;
      paVar3 = &line_comment_1.field_2;
      uVar12 = (uint3)local_3304;
      uVar13 = (uint3)uVar51;
      if (proposals._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
        cVar23 = target_label[0];
        asm_writer::anon_class_24_3_79b0c3fc::operator()
                  (&line_use_comment,&variant_writer,(StringBuilder *)&header,
                   proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color,
                   (Proposal *)
                   &proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent,
                   target_label[0] != '\0');
        iVar30 = numBitsNeeded;
        if ((cVar23 == '\0') || (line_use_comment._M_string_length == 0)) {
          line_comment_1._M_dataplus._M_p = (pointer)paVar3;
          sVar35 = strlen(target_1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&line_comment_1,target_1,target_1 + sVar35);
          use_comment_1._M_dataplus._M_p = (pointer)&use_comment_1.field_2;
          sVar35 = strlen((char *)&header);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&use_comment_1,&header,(long)local_1028 + (sVar35 - 0x10));
          anon_unknown.dwarf_190be::AsmWriteWLADX::writeInstruction
                    (&writer,p,iVar30,numBytesUsed,&line_comment_1,&use_comment_1,
                     (CombinationBool)(uVar12 | (uint3)(uVar50 << 8) | (uint3)(local_3308 << 0x10)),
                     (CombinationBool)(uVar14 | (uint3)(uVar56 << 8) | (uint3)(local_3300 << 0x10)),
                     (Combination8)
                     (uVar13 & 0xff | (uint3)(uVar32 << 8) | (uint3)(local_3324 << 0x10)),
                     (Combination16)(uVar49 | uVar59 | local_32e8),uVar53 != 0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)use_comment_1._M_dataplus._M_p != &use_comment_1.field_2) {
            operator_delete(use_comment_1._M_dataplus._M_p);
          }
          _Var55._M_p = line_comment_1._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)line_comment_1._M_dataplus._M_p != paVar3) goto LAB_00129109;
        }
        else {
          sprintf((char *)&line_comment_1,target_label,line_use_comment._M_dataplus._M_p);
          iVar30 = numBitsNeeded;
          use_comment_1._M_dataplus._M_p = (pointer)&use_comment_1.field_2;
          sVar35 = strlen((char *)&line_comment_1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&use_comment_1,&line_comment_1,
                     (long)&line_comment_1._M_dataplus._M_p + sVar35);
          name_2._M_dataplus._M_p = (pointer)&name_2.field_2;
          sVar35 = strlen((char *)&header);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&name_2,&header,(long)local_1028 + (sVar35 - 0x10));
          anon_unknown.dwarf_190be::AsmWriteWLADX::writeInstruction
                    (&writer,p,iVar30,numBytesUsed,&use_comment_1,&name_2,
                     (CombinationBool)(uVar12 | (uint3)(uVar50 << 8) | (uint3)(local_3308 << 0x10)),
                     (CombinationBool)(uVar14 | (uint3)(uVar56 << 8) | (uint3)(local_3300 << 0x10)),
                     (Combination8)
                     (uVar13 & 0xff | (uint3)(uVar32 << 8) | (uint3)(local_3324 << 0x10)),
                     (Combination16)(uVar49 | uVar59 | local_32e8),uVar53 != 0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name_2._M_dataplus._M_p != &name_2.field_2) {
            operator_delete(name_2._M_dataplus._M_p);
          }
          _Var55._M_p = use_comment_1._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)use_comment_1._M_dataplus._M_p != &use_comment_1.field_2) {
LAB_00129109:
            operator_delete(_Var55._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line_use_comment._M_dataplus._M_p != &line_use_comment.field_2) {
          operator_delete(line_use_comment._M_dataplus._M_p);
        }
      }
      else {
        line_comment_1._M_dataplus._M_p = (pointer)paVar3;
        sVar35 = strlen(target_1);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&line_comment_1,target_1,target_1 + sVar35);
        anon_unknown.dwarf_190be::AsmWriteWLADX::writeInstruction
                  (&writer,p,iVar30,numBytesUsed,&line_comment_1,&line_comment,
                   (CombinationBool)(uVar12 | (uint3)(uVar50 << 8) | (uint3)(local_3308 << 0x10)),
                   (CombinationBool)(uVar14 | (uint3)(uVar56 << 8) | (uint3)(local_3300 << 0x10)),
                   (Combination8)
                   (uVar13 & 0xff | (uint3)(uVar32 << 8) | (uint3)(local_3324 << 0x10)),
                   (Combination16)(uVar49 | uVar59 | local_32e8),uVar53 != 0);
        p_Var39 = proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line_comment_1._M_dataplus._M_p != paVar3) {
          operator_delete(line_comment_1._M_dataplus._M_p);
          p_Var39 = proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        for (; (_Rb_tree_header *)p_Var39 != &proposals._M_t._M_impl.super__Rb_tree_header;
            p_Var39 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var39)) {
          _Var52 = p_Var39[1]._M_color;
          p_00 = &p_Var39[1]._M_parent;
          asm_writer::anon_class_24_3_79b0c3fc::operator()
                    (&line_comment_1,&variant_writer,(StringBuilder *)&header,_Var52,
                     (Proposal *)p_00,false);
          iVar30 = (int)p_00;
          line_use_comment._M_dataplus._M_p = (pointer)&line_use_comment.field_2;
          sVar35 = strlen((char *)&header);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&line_use_comment,(StringBuilder *)&header,
                     (long)local_1028 + (sVar35 - 0x10));
          anon_unknown.dwarf_190be::AsmWriteWLADX::writeComment
                    (&writer,p,&line_use_comment,_Var52,iVar30);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)line_use_comment._M_dataplus._M_p != &line_use_comment.field_2) {
            operator_delete(line_use_comment._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)line_comment_1._M_dataplus._M_p != paVar3) {
            operator_delete(line_comment_1._M_dataplus._M_p);
          }
        }
      }
      if ((((uVar53 == 0) && (bVar24 == 1)) && (bVar6 == 0)) &&
         (variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
          _M_impl.super__Vector_impl_data._M_start)) {
        uVar38 = 0;
        do {
          pOVar1 = variants.
                   super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar38;
          memset(&line_comment_1,0,0x1004);
          if (bVar4 != 0 || bVar25 != 0) {
            if (bVar4 != 0) {
              *(undefined4 *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048) = 0x3d5820;
              local_2048 = local_2048 + 3;
            }
            if (bVar25 != 0) {
              *(undefined4 *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048) = 0x3d5920;
              local_2048 = local_2048 + 3;
            }
            line_use_comment._M_dataplus._M_p = (pointer)0xffffffff;
            line_use_comment._M_string_length =
                 line_use_comment._M_string_length & 0xffffffff00000000;
            Range::add((Range *)&line_use_comment,(uint)(&pOVar1->X)[bVar4 ^ 1]);
            uVar50 = (uint)uVar38;
            uVar53 = 0;
            bVar42 = true;
            do {
              uVar50 = uVar50 + 1;
              uVar45 = (ulong)uVar50;
              uVar61 = ((long)variants.
                              super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)variants.
                              super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
              if (uVar61 < uVar45 || uVar61 - uVar45 == 0) break;
              if (((pOVar1->DB ==
                    variants.
                    super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar45].DB) &&
                  (pOVar54 = variants.
                             super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar45,
                  pOVar1->DP == pOVar54->DP)) &&
                 (pOVar1->indirect_base_pointer == pOVar54->indirect_base_pointer)) {
                uVar28 = (&pOVar54->X)[bVar4 ^ 1];
                if (line_use_comment._M_dataplus._M_p._4_4_ < 2) {
LAB_001292aa:
                  Range::add((Range *)&line_use_comment,(uint)uVar28);
                }
                else {
                  if (((int)line_use_comment._M_string_length *
                       line_use_comment._M_dataplus._M_p._4_4_ +
                       (int)line_use_comment._M_dataplus._M_p == (uint)uVar28) ||
                     ((int)line_use_comment._M_string_length *
                      (line_use_comment._M_dataplus._M_p._4_4_ - 1) +
                      (int)line_use_comment._M_dataplus._M_p == (uint)uVar28)) goto LAB_001292aa;
                  lVar40 = (long)local_2048;
                  if (lVar40 < 0x81) {
                    if (!bVar42) {
                      *(undefined1 *)((long)&line_comment_1._M_dataplus._M_p + lVar40 + 2) = 0;
                      *(undefined2 *)((long)&line_comment_1._M_dataplus._M_p + lVar40) = 0x202c;
                      local_2048 = local_2048 + 2;
                    }
                    Range::format((Range *)&line_use_comment,(StringBuilder *)&line_comment_1);
                    bVar42 = false;
                  }
                  else {
                    uVar53 = uVar53 + 1;
                  }
                  line_use_comment._M_dataplus._M_p = (pointer)0xffffffff;
                  line_use_comment._M_string_length =
                       line_use_comment._M_string_length & 0xffffffff00000000;
                }
                uVar38 = (ulong)((int)uVar38 + 1);
                bVar63 = true;
              }
              else {
                bVar63 = false;
              }
            } while (bVar63);
            if ((uVar53 == 0) && (line_use_comment._M_dataplus._M_p._4_4_ != 0)) {
              if (!bVar42) {
                *(undefined1 *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048 + 2) = 0;
                *(undefined2 *)((long)&line_comment_1._M_dataplus._M_p + (long)local_2048) = 0x202c;
                local_2048 = local_2048 + 2;
              }
              Range::format((Range *)&line_use_comment,(StringBuilder *)&line_comment_1);
            }
            else if (uVar53 != 0) {
              StringBuilder::format((StringBuilder *)&line_comment_1," (and %d more)",(ulong)uVar53)
              ;
            }
          }
          memset((StringBuilder *)&line_use_comment,0,0x1004);
          use_comment_1._M_dataplus._M_p = (pointer)&use_comment_1.field_2;
          use_comment_1._M_string_length = 0;
          use_comment_1.field_2._M_local_buf[0] = '\0';
          psVar44 = &use_comment_1;
          iVar29 = 0;
          AnnotationResolver::label(&name_2,annotations,pOVar1->indirect_base_pointer,psVar44,false)
          ;
          iVar30 = (int)psVar44;
          StringBuilder::format
                    ((StringBuilder *)&line_use_comment,"indirect base=%06X",
                     (ulong)pOVar1->indirect_base_pointer);
          if (bVar57 != 0) {
            StringBuilder::format((StringBuilder *)&line_use_comment,", DP=%X",(ulong)pOVar1->DP);
          }
          if ((uVar31 & 1) != 0) {
            StringBuilder::format((StringBuilder *)&line_use_comment,", DB=%X",(ulong)pOVar1->DB);
          }
          if (local_2048 != 0) {
            sVar35 = strlen((char *)&line_comment_1);
            iVar30 = 0;
            memcpy((void *)((long)&line_use_comment._M_dataplus._M_p + (long)local_1040),
                   &line_comment_1,(long)((sVar35 << 0x20) + 0x100000000) >> 0x20);
            local_1040 = local_1040 + (int)sVar35;
          }
          sVar22 = name_2._M_string_length;
          if (name_2._M_string_length != 0) {
            *(undefined4 *)((long)&line_use_comment._M_dataplus._M_p + (long)local_1040) = 0x202d20;
            iVar30 = local_1040 + 3;
            memcpy((void *)((long)&line_use_comment._M_dataplus._M_p + (long)local_1040 + 3),
                   name_2._M_dataplus._M_p,
                   (long)((name_2._M_string_length << 0x20) + 0x100000000) >> 0x20);
            local_1040 = local_1040 + 3 + (int)sVar22;
          }
          sVar22 = use_comment_1._M_string_length;
          if (use_comment_1._M_string_length != 0) {
            *(undefined4 *)((long)&line_use_comment._M_dataplus._M_p + (long)local_1040) = 0x202d20;
            iVar30 = local_1040 + 3;
            memcpy((void *)((long)&line_use_comment._M_dataplus._M_p + (long)local_1040 + 3),
                   use_comment_1._M_dataplus._M_p,
                   (long)((use_comment_1._M_string_length << 0x20) + 0x100000000) >> 0x20);
            local_1040 = local_1040 + 3 + (int)sVar22;
          }
          local_3168._M_dataplus._M_p = (pointer)&local_3168.field_2;
          sVar35 = strlen((char *)&line_use_comment);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3168,&line_use_comment,
                     (long)&line_use_comment._M_dataplus._M_p + sVar35);
          anon_unknown.dwarf_190be::AsmWriteWLADX::writeComment(&writer,p,&local_3168,iVar30,iVar29)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3168._M_dataplus._M_p != &local_3168.field_2) {
            operator_delete(local_3168._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name_2._M_dataplus._M_p != &name_2.field_2) {
            operator_delete(name_2._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)use_comment_1._M_dataplus._M_p != &use_comment_1.field_2) {
            operator_delete(use_comment_1._M_dataplus._M_p);
          }
          uVar38 = (ulong)((int)uVar38 + 1);
          uVar61 = ((long)variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
        } while (uVar38 <= uVar61 && uVar61 - uVar38 != 0);
      }
      pDVar10 = (trace->dma_transfers).
                super__Vector_base<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((((long)(trace->dma_transfers).
                  super__Vector_base<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar10 >> 2) *
           -0x3333333333333333 != 0) && (pDVar10->pc == p)) {
        memset(&line_comment_1,0,0x1004);
        __assert_fail("d.b_address == 0x80",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                      ,0x3c0,
                      "void snestistics::asm_writer(ReportWriter &, const Options &, Trace &, const AnnotationResolver &, const RomAccessor &)"
                     );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line_comment._M_dataplus._M_p != &line_comment.field_2) {
        operator_delete(line_comment._M_dataplus._M_p);
      }
      uVar50 = numBytesUsed + p;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&proposals._M_t);
      p_Var41 = (_Base_ptr)std::_Rb_tree_increment(p_Var41);
    } while ((_Rb_tree_header *)p_Var41 != p_Var36);
  }
  if (variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(variants.
                    super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((writer.m_outFile != (FILE *)0x0) && (writer.m_bankOpen == true)) {
    fwrite("\n.ENDS\n\n",8,1,(FILE *)writer.m_outFile);
  }
  return;
}

Assistant:

void asm_writer(ReportWriter &report, const Options &options, Trace &trace, const AnnotationResolver &annotations, const RomAccessor &rom_accessor) {
	AsmWriteWLADX writer(report, options, rom_accessor);

	int next_dma_event = 0;

	for (const Annotation &a : annotations._annotations) {
		if (a.type == ANNOTATION_FUNCTION || (a.type == ANNOTATION_LINE && !a.name.empty()))
			trace.labels.set_bit(a.startOfRange);
	}

	writer.writeSeperator("Header");

	if (!options.asm_header_file.empty()) {
		Array<unsigned char> header;
		read_file(options.asm_header_file, header);
		fwrite(&header[0], header.size(), 1, report.report);
		char newline = '\n';
		fwrite(&newline, 1, 1, report.report);
	}

	writer.write_vectors(annotations, trace.labels);

	writer.writeSeperator("Data");

	// Generate EQU for each label
	// TODO: Only include USED labels?
	for (const Annotation &a : annotations._annotations) {
		if (a.type != ANNOTATION_DATA)
			continue;

		// NOTE: We only use 16-bit here... the high byte is almost never used in an op
		// TODO: Validate so this doesn't mess thing up when we use it
		char target[512];
		sprintf(target, "$%04X", a.startOfRange&0xFFFF);
		writer.writeDefine(a.name, target, a.comment.empty() ? a.useComment : a.comment);
	}

	writer.writeSeperator("Code");

	Pointer nextOp(INVALID_POINTER);

	std::vector<OpInfo> variants;
	variants.reserve(1024*64);

	// Now iterate the ops
	for (auto opsit = trace.ops.begin(); opsit != trace.ops.end(); ++opsit) {
		const Pointer pc = opsit->first;

		if (nextOp == INVALID_POINTER) {
			nextOp = pc;
		}

		bool emitted_label = false;

		// TODO: Emit any labels that we might have skipped as well as label for current line
		//       This is mostly if the static jump predictor is predicting a jump into non-ops.
		for (Pointer p(nextOp); p <= pc; ++p) {
			if (trace.labels[p]) {
				// Emit label?
				std::string label, line_comment, line_use_comment;

				annotations.line_info(p, &label, &line_comment, &line_use_comment, true);

				std::string description = line_comment;
				if (line_comment.empty()) {
					description = line_use_comment;
				}

				bool shortmode = false;//!multiline && description.size() < 20;

				writer.writeLabel(p, label, shortmode ? "" : description, shortmode ? description : "");

				if (p == pc)
					emitted_label = true;
			}
		}

		const Trace::OpVariantLookup variant_lookup = opsit->second;
		assert(variant_lookup.count != 0);

		const uint8_t *data = rom_accessor.evalPtr(pc);
		const uint8_t opcode = *data;

		// Determine number of bytes needed for this instruction
		// Here I've assumed that either these flags agree for ALL variants, or that they are irrelevant for this opcode
		const OpInfo &first_variant = trace.variant(variant_lookup, 0);
		const bool acc16 = is_memory_accumulator_wide(first_variant.P);
		const bool ind16 = is_index_wide(first_variant.P);
		const bool emu   = is_emulation_mode(first_variant.P);
		const bool is_predicted = trace.is_predicted[pc];
		if (emu) printf("emu mode at pc %06X\n", pc);

		char target[128] = "\0";
		char target_label[128] = "\0";
		int numBitsNeeded = 8;

		const uint32_t numBytesNeeded = calculateFormattingandSize(data, acc16, ind16, target, target_label, &numBitsNeeded);

		nextOp = pc + numBytesNeeded;

		typedef std::string Proposal;
		typedef std::map<Pointer, Proposal> Proposals;
		Proposals proposals; // Given destionation/source give comment on how we got there

		const bool is_jump = jumps[opcode]; // TODO: Cover all jumps we want? And not too many?

		// Does adress depend on ....?
		bool is_indirect = cputable::is_indirect(opcode);
		const bool depend_X = cputable::address_depend_x(opcode);
		const bool depend_Y = cputable::address_depend_y(opcode);
		const bool depend_DB = cputable::address_depend_db(opcode);
		const bool depend_DP = is_jump ? false : cputable::address_depend_dp(opcode);

		// First copy all variants into our local vector where we can modify
		variants.resize(variant_lookup.count);
		memcpy(&variants[0], &trace.ops_variants[variant_lookup.offset], variant_lookup.count * sizeof(OpInfo));

		// These know if they have been assigned no value, one value (maybe multiple times) or multiple different values
		Combination8 shared_db;
		Combination16 shared_dp;
		CombinationBool accumulator_wide;
		CombinationBool index_wide;

		{
			// NOTE-TODO: While an op might depend on say DB it might not use it if adress is in $0000-$1999

			// Zero out unused registers so our sort get items in correct order
			for (OpInfo &o : variants) {
				accumulator_wide = is_memory_accumulator_wide(o.P);
				index_wide = is_index_wide(o.P);
				shared_dp = o.DP;
				shared_db = o.DB;
				if (!depend_X) o.X = 0;
				if (!depend_Y) o.Y = 0;
				if (!depend_DB) o.DB = 0;
				if (!depend_DP) o.DP = 0;
				if (!is_indirect) o.indirect_base_pointer = 0;
			}
		}

		if (opcode == 0x82) {
			// BRL
			uint16_t operand16 = data[1]|(data[2]<<8);
			const Pointer branch_target = branch16(pc, operand16);
			proposals[branch_target] = "";
		} else if (branches[opcode]) {
			const Pointer branch_target = branch8(pc, data[1]);
			proposals[branch_target] = "";
		} else {
			// Sort and make variants unique
			std::sort(variants.begin(), variants.end());

			uint32_t num_unique_variants = 0;

			// Remove duplicates
			for (uint32_t source_idx = 0; source_idx < variants.size(); source_idx++) {
				if (num_unique_variants == 0 || variants[source_idx] != variants[num_unique_variants - 1]) {
					variants[num_unique_variants++] = variants[source_idx];
				}
			}
			variants.resize(num_unique_variants);

			if (is_jump) {
				for (uint32_t variant_idx = 0; variant_idx < variants.size(); ++variant_idx) {
					const OpInfo &vit = variants[variant_idx];
					if (vit.jump_target == INVALID_POINTER)
						continue;
					StringBuilder sb;
					sb.clear();
					if (depend_X)
						sb.format("[X=%04X]", vit.X);
					proposals[vit.jump_target] = sb.c_str();
				}

			} else if (!is_predicted) {

				for (uint32_t variant_idx = 0; variant_idx < variants.size(); ++variant_idx) {

					const OpInfo &vit = variants[variant_idx];

					StringBuilder ranges;
					if (depend_X||depend_Y) {
						if (depend_X) ranges.add("X=");
						if (depend_Y) ranges.add("Y=");

						int max_size = 80;
						int skipped = 0;

						bool first = true;

						Range r;
						r.add(depend_X?vit.X:vit.Y);
						for (uint32_t v = variant_idx+1; v < variants.size(); ++v) {
							const OpInfo &vi = variants[v];
							if (vi.DB != vit.DB || vi.DP != vit.DP)
								break;
							int value = depend_X ? variants[v].X : variants[v].Y;
							if (r.fits(value)) {
								r.add(value);
							} else {
								bool skip = ranges.length() >= max_size;
								if (!skip) {
									if (!first) ranges.add(", "); first = false;
									r.format(ranges);
								} else {
									skipped++;
								}
								r.reset();
								r.add(value);
							}
							variant_idx++;
						}
						if (skipped == 0) {
							if (!first) ranges.add(", "); first = false;
							r.format(ranges);
						} else {
							ranges.format(" and %d more", skipped);
						}
					}

					CPURegisters reg;
					reg.P = vit.P;
					reg.dp = vit.DP;
					reg.db = vit.DB;
					reg.pc = pc & 0xFFFF;
					reg.pb = pc >> 16;
					reg.reg_X = 0; // Start at 0 to get base pointer
					reg.reg_Y = 0; // Start at 0 to get base pointer
					MagicByte rb(0);
					MagicWord ra(0);
					ra.set_unknown();
					rb.set_unknown();
					assert(!ra.isKnown() && !rb.isKnown());
					const ResultType r = evaluateOp(rom_accessor, data, reg, &rb, &ra, nullptr, nullptr, nullptr, nullptr);

					if (r == SA_ADRESS && rb.isKnown() && ra.isKnown()) {
						const Pointer p = rom_accessor.lorom_bank_remap((rb.value << 16) | ra.value);

						//if((p>>16)!=rb.value) // data bank was removed due to adressing being shuffled into 7E
						// depend_DB = false;

						if (proposals.find(p) != proposals.end())
							continue;

						std::string use_comment;

						bool has_remark = depend_DB || depend_DP || !ranges.empty();

						StringBuilder sb;
						if (!use_comment.empty()) {
							sb.add(use_comment);
							if (has_remark)
								sb.add(" ");
						}
						bool first = true;
						if (has_remark)
							sb.add("[");
						if (depend_DB) {
							if (!first) sb.add(" "); first = false;
							sb.format("DB=%X", vit.DB);
						}
						if (depend_DP) {
							if (!first) sb.add(" "); first = false;
							sb.format("DP=%X", vit.DP);
						}
						if (!ranges.empty()) {
							if (!first) sb.add(" "); first = false;
							sb.add(ranges.c_str());
						}
						if (has_remark)
							sb.add("]");

						proposals[p] = sb.c_str();
					}
				}
			}
		}

		std::string line_comment;
		if (!emitted_label) {
			annotations.line_info(pc, nullptr, &line_comment, nullptr, false);
		}

		auto variant_writer = [&annotations, &line_comment, is_jump](StringBuilder &ss, const Pointer target_pointer, const Proposal &p, bool name_in_code) {
			ss.clear();
			std::string use_comment, pointer_comment = p;
			const std::string name = annotations.label(target_pointer, &use_comment, is_jump);

			if (!name_in_code || name.empty()) {
				if (!name.empty()) {
					ss.format("%s ", name.c_str()); // Name
				} else {
					ss.format("%06X ", target_pointer);
				}
			}

			bool first = true;
			if (!line_comment.empty()) {
				if (!first) ss.add(" - "); first = false;
				ss.add(line_comment);
			}
			if (!use_comment.empty()) {
				if (!first) ss.add(" - "); first = false;
				ss.add(use_comment);
			}
			if (!pointer_comment.empty()) {
				if (!first) ss.add(" - "); first = false;
				ss.add(pointer_comment);
			}
			return name;
		};

		StringBuilder ss;

		if (proposals.size() == 1) {

			// All variant agree that this is the only choice
			// If we have a valid label we might be able to use that in the op-code
			// It might not be possible to codify it though since it might generate the wrong opcode
			// If target_label is non-empty we can codify using a label

			const bool name_in_code = strcmp(target_label, "") != 0;
			std::string name = variant_writer(ss, proposals.begin()->first, proposals.begin()->second, name_in_code);

			if (!name_in_code || name.empty()) {
				writer.writeInstruction(pc, numBitsNeeded, numBytesNeeded, target, ss.c_str(), accumulator_wide, index_wide, shared_db, shared_dp, is_predicted);
			} else {
				char wow[256];
				sprintf(wow, target_label, name.c_str());
				writer.writeInstruction(pc, numBitsNeeded, numBytesNeeded, wow, ss.c_str(), accumulator_wide, index_wide, shared_db, shared_dp, is_predicted);
			}
		} else {
			writer.writeInstruction(pc, numBitsNeeded, numBytesNeeded, target, line_comment, accumulator_wide, index_wide, shared_db, shared_dp, is_predicted);
			// List all possible targets in comments!
			for (auto pit = proposals.begin(); pit != proposals.end(); ++pit) {
				std::string name = variant_writer(ss, pit->first, pit->second, false);
				writer.writeComment(pc, ss.c_str(), 0, 10);
			}
		}

		if (is_indirect && !is_jump && !is_predicted) {
			for (uint32_t variant_idx = 0; variant_idx < variants.size(); ++variant_idx) {

				const OpInfo &v = variants[variant_idx];

				StringBuilder ranges;
					
				if (depend_X||depend_Y) {
					if (depend_X) ranges.add(" X=");
					if (depend_Y) ranges.add(" Y=");
					Range r;
					bool first = true;
					int skipped = 0;

					r.add(depend_X ? v.X : v.Y);

					for (uint32_t vi2 = variant_idx+1; vi2 < variants.size(); ++vi2) {
						const OpInfo &v2 = variants[vi2];
						if (v.DB != v2.DB) break;
						if (v.DP != v2.DP) break;
						if (v.indirect_base_pointer != v2.indirect_base_pointer) break;

						int value = depend_X ? v2.X : v2.Y;

						if (r.fits(value)) {
							r.add(value);
								
						} else {
							if (ranges.length() > 128) {
								skipped++;
							} else {
								if (!first)	ranges.add(", "); first = false;
								r.format(ranges);
							}
							r.reset();
						}

						variant_idx++;
					}
					if (skipped==0 && r.N != 0) {
						if (!first)	ranges.add(", "); first = false;
						r.format(ranges);
					} else if (skipped !=0) {
						ranges.format(" (and %d more)", skipped);
					}
				}

				StringBuilder ss;

				std::string use_comment;
				const std::string name = annotations.label(v.indirect_base_pointer, &use_comment, is_jump);

				ss.format("indirect base=%06X", v.indirect_base_pointer);
				if (depend_DP) ss.format(", DP=%X", v.DP);
				if (depend_DB) ss.format(", DB=%X", v.DB);

				if (!ranges.empty()) {
					ss.add(ranges.c_str());
				}

				if (!name.empty()) {
					ss.add(" - ", name);
				}

				if (!use_comment.empty()) {
					ss.add(" - ", use_comment);
				}

				writer.writeComment(pc, ss.c_str(), 0, 10);
			}
		}

		while (next_dma_event < trace.dma_transfers.size() && trace.dma_transfers[next_dma_event].pc == pc) {
			const DmaTransfer &d = trace.dma_transfers[next_dma_event++];
			StringBuilder ss;
			bool reverse = d.flags & DmaTransfer::REVERSE_TRANSFER;
			int num_bytes = d.transfer_bytes == 0 ? 0x10000 : d.transfer_bytes;
			assert(d.b_address == 0x80); // So we can detect that we've enabled more and can improve
			ss.format("dma-event $%02X:%04X %s $%02X:%04X (via $2180), $%X/%d bytes%s%s", d.a_bank, d.a_address, reverse ? "<-" : "->", d.wram>>16, d.wram&0xFFFF, num_bytes, num_bytes, d.flags & DmaTransfer::A_ADDRESS_DECREMENT ?" (decrease A)":"", d.flags & DmaTransfer::A_ADDRESS_FIXED ? " (A fixed)":"");
			writer.writeComment(pc, ss.c_str(), 0, 10);
		}
	}
}